

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

void j2k_write_poc(opj_j2k_t *j2k)

{
  OPJ_UINT32 OVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  OPJ_UINT32 OVar5;
  opj_tcp_t *poVar6;
  opj_tccp_t *poVar7;
  opj_cio_t *cio;
  int iVar8;
  OPJ_UINT32 OVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  
  OVar1 = j2k->image->numcomps;
  poVar6 = j2k->cp->tcps;
  iVar2 = j2k->curtileno;
  poVar7 = poVar6[iVar2].tccps;
  cio = j2k->cio;
  iVar12 = poVar6[iVar2].numpocs;
  uVar11 = iVar12 + 1;
  cio_write(cio,0xff5f,2);
  cio_write(cio,(long)(int)(((uint)(0x100 < (int)OVar1) * 2 + 7) * uVar11 + 2),2);
  if (-1 < iVar12) {
    iVar12 = (0x100 < (int)OVar1) + 1;
    lVar10 = 0;
    do {
      cio_write(cio,(ulong)*(uint *)(poVar6[iVar2].pocs[0].progorder + lVar10 + -0x28),1);
      cio_write(cio,(ulong)*(uint *)(poVar6[iVar2].pocs[0].progorder + lVar10 + -0x24),iVar12);
      cio_write(cio,(ulong)*(uint *)(poVar6[iVar2].pocs[0].progorder + lVar10 + -0x20),2);
      iVar3 = *(int *)(poVar6[iVar2].pocs[0].progorder + lVar10 + -0x20);
      uVar4 = *(uint *)(poVar6[iVar2].pocs[0].progorder + lVar10 + -0x1c);
      iVar8 = poVar6[iVar2].numlayers;
      if (iVar3 < poVar6[iVar2].numlayers) {
        iVar8 = iVar3;
      }
      *(int *)(poVar6[iVar2].pocs[0].progorder + lVar10 + -0x20) = iVar8;
      cio_write(cio,(ulong)uVar4,1);
      OVar9 = poVar7->numresolutions;
      OVar5 = *(OPJ_UINT32 *)(poVar6[iVar2].pocs[0].progorder + lVar10 + -0x1c);
      uVar4 = *(uint *)(poVar6[iVar2].pocs[0].progorder + lVar10 + -0x18);
      if ((int)OVar5 < (int)OVar9) {
        OVar9 = OVar5;
      }
      *(OPJ_UINT32 *)(poVar6[iVar2].pocs[0].progorder + lVar10 + -0x1c) = OVar9;
      cio_write(cio,(ulong)uVar4,iVar12);
      OVar9 = *(OPJ_UINT32 *)(poVar6[iVar2].pocs[0].progorder + lVar10 + -0x18);
      if ((int)OVar1 <= (int)OVar9) {
        OVar9 = OVar1;
      }
      *(OPJ_UINT32 *)(poVar6[iVar2].pocs[0].progorder + lVar10 + -0x18) = OVar9;
      cio_write(cio,(long)*(int *)(poVar6[iVar2].pocs[0].progorder + lVar10 + -4),1);
      lVar10 = lVar10 + 0x94;
    } while ((ulong)uVar11 * 0x94 - lVar10 != 0);
  }
  return;
}

Assistant:

static void j2k_write_poc(opj_j2k_t *j2k) {
	int len, numpchgs, i;

	int numcomps = j2k->image->numcomps;
	
	opj_cp_t *cp = j2k->cp;
	opj_tcp_t *tcp = &cp->tcps[j2k->curtileno];
	opj_tccp_t *tccp = &tcp->tccps[0];
	opj_cio_t *cio = j2k->cio;

	numpchgs = 1 + tcp->numpocs;
	cio_write(cio, J2K_MS_POC, 2);	/* POC  */
	len = 2 + (5 + 2 * (numcomps <= 256 ? 1 : 2)) * numpchgs;
	cio_write(cio, len, 2);		/* Lpoc */
	for (i = 0; i < numpchgs; i++) {
		opj_poc_t *poc = &tcp->pocs[i];
		cio_write(cio, poc->resno0, 1);	/* RSpoc_i */
		cio_write(cio, poc->compno0, (numcomps <= 256 ? 1 : 2));	/* CSpoc_i */
		cio_write(cio, poc->layno1, 2);	/* LYEpoc_i */
		poc->layno1 = int_min(poc->layno1, tcp->numlayers);
		cio_write(cio, poc->resno1, 1);	/* REpoc_i */
		poc->resno1 = int_min(poc->resno1, tccp->numresolutions);
		cio_write(cio, poc->compno1, (numcomps <= 256 ? 1 : 2));	/* CEpoc_i */
		poc->compno1 = int_min(poc->compno1, numcomps);
		cio_write(cio, poc->prg, 1);	/* Ppoc_i */
	}
}